

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPT.cpp
# Opt level: O1

string * __thiscall CPT::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,CPT *this)

{
  size_type sVar1;
  size_type sVar2;
  char cVar3;
  ostream *poVar4;
  size_type sVar5;
  size_type sVar6;
  stringstream ss;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  sVar1 = (this->_m_probTable).size2_;
  if (sVar1 != 0) {
    sVar2 = (this->_m_probTable).size1_;
    sVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"CPT y=",6);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," x:",3);
      if (sVar2 != 0) {
        sVar6 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
          std::ostream::_M_insert<double>
                    ((this->_m_probTable).data_.data_[(this->_m_probTable).size2_ * sVar6 + sVar5]);
          sVar6 = sVar6 + 1;
        } while (sVar2 != sVar6);
      }
      cVar3 = (char)(ostream *)local_1a8;
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      sVar5 = sVar5 + 1;
    } while (sVar5 != sVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string CPT::SoftPrint() const
{
    stringstream ss;
    size_t X = _m_probTable.size1();
    size_t Y = _m_probTable.size2();
    for(size_t y=0; y < Y; y++) 
    {
        ss << "CPT y=" << y << " x:";
        for(size_t x=0; x < X; x++) 
            ss << " " << _m_probTable(x,y);
        ss << endl;
    }
    return(ss.str());
}